

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

NodeTraversalSignal
prvTidyTraverseNodeTree(TidyDocImpl *doc,Node *node,NodeTraversalCallBack *cb,void *propagate)

{
  NodeTraversalSignal NVar1;
  bool bVar2;
  NodeTraversalSignal unaff_EBP;
  
  do {
    if (node == (Node *)0x0) {
      return ContinueTraversal;
    }
    NVar1 = (*cb)(doc,node,propagate);
    if ((NVar1 & ~SkipSiblings) == ContinueTraversal && node->content != (Node *)0x0) {
      NVar1 = prvTidyTraverseNodeTree(doc,node->content,cb,propagate);
    }
    bVar2 = true;
    if (NVar1 - SkipSiblings < 2) {
      unaff_EBP = ContinueTraversal;
    }
    else if (NVar1 == ExitTraversal) {
      unaff_EBP = ExitTraversal;
    }
    else {
      if (NVar1 == VisitParent) {
        node = node->parent;
      }
      else {
        node = node->next;
      }
      bVar2 = false;
    }
  } while (!bVar2);
  return unaff_EBP;
}

Assistant:

NodeTraversalSignal TY_(TraverseNodeTree)(TidyDocImpl* doc, Node* node, NodeTraversalCallBack *cb, void *propagate )
{
    while (node)
    {
        NodeTraversalSignal s = (*cb)(doc, node, propagate);

        if (node->content && (s == ContinueTraversal || s == SkipSiblings))
        {
            s = TY_(TraverseNodeTree)(doc, node->content, cb, propagate);
        }

        switch (s)
        {
        case ExitTraversal:
            return ExitTraversal;

        case VisitParent:
            node = node->parent;
            continue;

        case SkipSiblings:
        case SkipChildrenAndSiblings:
            return ContinueTraversal;

        default:
            node = node->next;
            break;
        }
    }
    return ContinueTraversal;
}